

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O2

TranslatorInfo * __thiscall
helics::TranslatorFederate::createTranslator
          (TranslatorFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view endpointType,string_view units)

{
  BaseType BVar1;
  GlobalHandle local_40;
  undefined1 local_38 [8];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = key._M_str;
  local_30._M_len = key._M_len;
  BVar1 = (this->mFedID).gid;
  local_38._0_4_ = dest.gid;
  if ((this->mCoreID).gid == dest.gid) {
    local_38._0_4_ = BVar1;
  }
  if (dest.gid == 0) {
    local_38._0_4_ = BVar1;
  }
  local_38._4_4_ = handle.hid;
  std::
  make_unique<helics::TranslatorInfo,helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (&local_40,(basic_string_view<char,_std::char_traits<char>_> *)local_38,&local_30,
             &endpointType);
  local_38 = *(undefined1 (*) [8])local_40;
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::insert
            (&this->translators,(GlobalHandle *)local_38,
             (unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
             &local_40);
  std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>::~unique_ptr
            ((unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
             &local_40);
  return (TranslatorInfo *)local_40;
}

Assistant:

TranslatorInfo* TranslatorFederate::createTranslator(GlobalBrokerId dest,
                                                     InterfaceHandle handle,
                                                     std::string_view key,
                                                     std::string_view endpointType,
                                                     std::string_view units)
{
    auto tran = std::make_unique<TranslatorInfo>(
        GlobalHandle{(dest == parent_broker_id || dest == mCoreID) ? GlobalBrokerId{mFedID} : dest,
                     handle},
        key,
        endpointType,
        units);

    auto cid = tran->id;
    auto* retTarget = tran.get();
    // auto actualKey = key;

    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    translators.insert(cid, std::move(tran));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}